

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O1

_Bool handle_options_item(menu *menu,ui_event *event,wchar_t oid)

{
  object_kind *kind;
  ui_event_type uVar1;
  int iVar2;
  object_kind *poVar3;
  _Bool _Var4;
  void *p;
  char *str;
  menu *menu_00;
  long lVar5;
  ulong uVar6;
  int count;
  long lVar7;
  region local_48;
  
  uVar1 = event->type;
  if (uVar1 == EVT_SELECT) {
    if ((uint)oid < 0x11) {
      iVar2 = sval_dependent[(uint)oid].tval;
      local_48.col = 1;
      local_48.row = 2;
      local_48.width = -1;
      local_48.page_rows = -1;
      p = mem_alloc((ulong)z_info->k_max << 5);
      count = 0;
      if (1 < z_info->k_max) {
        count = 0;
        uVar6 = 1;
        lVar5 = 0x2a0;
        do {
          poVar3 = k_info;
          if ((*(long *)(k_info->flags + lVar5 + -0x80) != 0) &&
             (*(int *)(k_info->flags + lVar5 + -0x5c) == iVar2)) {
            kind = (object_kind *)(k_info->flags + lVar5 + -0x80);
            if ((&k_info->aware)[lVar5] == false) {
              lVar7 = (long)count;
              *(object_kind **)((long)p + lVar7 * 0x10) = kind;
              count = count + 1;
              *(undefined1 *)((long)p + lVar7 * 0x10 + 8) = 0;
            }
            if ((((&poVar3->everseen)[lVar5] == true) &&
                (_Var4 = flag_has_dbg(poVar3->kind_flags + lVar5,2,4,"kind->kind_flags",
                                      "KF_INSTA_ART"), !_Var4)) ||
               (_Var4 = tval_is_money_k(kind), _Var4)) {
              lVar7 = (long)count;
              *(object_kind **)((long)p + lVar7 * 0x10) = kind;
              count = count + 1;
              *(undefined1 *)((long)p + lVar7 * 0x10 + 8) = 1;
            }
          }
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0x2a0;
        } while (uVar6 < z_info->k_max);
      }
      if (count == 0) {
        mem_free(p);
      }
      else {
        if ((5 < iVar2 - 0x1eU) && (1 < iVar2 - 0x12U)) {
          sort(p,(long)count,0x10,cmp_ignore);
        }
        screen_save();
        clear_from(L'\0');
        str = format("Ignore the following %s:");
        prt(str,L'\0',L'\0');
        menu_00 = menu_new(MN_SKIN_COLUMNS,&ignore_sval_menu);
        menu_setpriv(menu_00,count,p);
        menu_00->cmd_keys = "Tt";
        menu_layout(menu_00,&local_48);
        menu_set_cursor_x_offset(menu_00,1);
        menu_select(menu_00,0,false);
        mem_free(menu_00);
        mem_free(p);
        screen_load();
      }
    }
    else {
      if (2 < (uint)(oid + L'\xffffffee')) {
        __assert_fail("(size_t) oid < N_ELEMENTS(extra_item_options)",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-options.c"
                      ,0x7c0,"_Bool handle_options_item(struct menu *, const ui_event *, int)");
      }
      (*extra_item_options[(uint)(oid + L'\xffffffee')].action)((char *)0x0,0);
    }
  }
  return uVar1 == EVT_SELECT;
}

Assistant:

static bool handle_options_item(struct menu *menu, const ui_event *event,
								int oid)
{
	if (event->type == EVT_SELECT) {
		if ((size_t) oid < N_ELEMENTS(sval_dependent))
		{
			sval_menu(sval_dependent[oid].tval, sval_dependent[oid].desc);
		} else {
			oid = oid - (int)N_ELEMENTS(sval_dependent) - 1;
			assert((size_t) oid < N_ELEMENTS(extra_item_options));
			extra_item_options[oid].action(NULL, 0);
		}

		return true;
	}

	return false;
}